

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O0

void __thiscall p2t::Triangle::MarkConstrainedEdge(Triangle *this,Point *p,Point *q)

{
  Point *q_local;
  Point *p_local;
  Triangle *this_local;
  
  if (((q == this->points_[0]) && (p == this->points_[1])) ||
     ((q == this->points_[1] && (p == this->points_[0])))) {
    this->constrained_edge[2] = true;
  }
  else if (((q == this->points_[0]) && (p == this->points_[2])) ||
          ((q == this->points_[2] && (p == this->points_[0])))) {
    this->constrained_edge[1] = true;
  }
  else if (((q == this->points_[1]) && (p == this->points_[2])) ||
          ((q == this->points_[2] && (p == this->points_[1])))) {
    this->constrained_edge[0] = true;
  }
  return;
}

Assistant:

void Triangle::MarkConstrainedEdge(Point* p, Point* q)
{
  if ((q == points_[0] && p == points_[1]) || (q == points_[1] && p == points_[0])) {
    constrained_edge[2] = true;
  } else if ((q == points_[0] && p == points_[2]) || (q == points_[2] && p == points_[0])) {
    constrained_edge[1] = true;
  } else if ((q == points_[1] && p == points_[2]) || (q == points_[2] && p == points_[1])) {
    constrained_edge[0] = true;
  }
}